

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::PinholeCamera::PinholeCamera(PinholeCamera *this,PinholeCamera *pc)

{
  double dVar1;
  Camera *in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  SMatrix<double,_3,_3> *in_stack_ffffffffffffffe0;
  Camera *in_stack_ffffffffffffffe8;
  
  Camera::Camera(in_RSI,in_stack_ffffffffffffffe8);
  in_RDI->v[0][0] = (double)&PTR__PinholeCamera_001f9860;
  SMatrix<double,_3,_3>::SMatrix(in_stack_ffffffffffffffe0,in_RDI);
  in_RDI[3].v[2][0] = in_RSI[1].R.v[0][2];
  in_RDI[3].v[2][1] = 0.0;
  if (in_RSI[1].R.v[1][0] != 0.0) {
    dVar1 = (double)(**(code **)(*(long *)in_RSI[1].R.v[1][0] + 0x10))();
    in_RDI[3].v[2][1] = dVar1;
  }
  return;
}

Assistant:

PinholeCamera::PinholeCamera(const PinholeCamera &pc) : Camera(pc), A(pc.A)
{
  rho=pc.rho;

  dist=0;

  if (pc.dist != 0)
  {
    dist=pc.dist->clone();
  }
}